

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_deblk_edge_filter.c
# Opt level: O1

void ihevc_deblk_chroma_vert
               (UWORD8 *pu1_src,WORD32 src_strd,WORD32 quant_param_p,WORD32 quant_param_q,
               WORD32 qp_offset_u,WORD32 qp_offset_v,WORD32 tc_offset_div2,WORD32 filter_flag_p,
               WORD32 filter_flag_q)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  
  if (filter_flag_q != 0 || filter_flag_p != 0) {
    iVar3 = quant_param_q + quant_param_p + 1 >> 1;
    uVar5 = qp_offset_u + iVar3;
    if (-1 < (int)uVar5) {
      if ((int)uVar5 < 0x3a) {
        uVar5 = gai4_ihevc_qp_table[uVar5];
      }
      else {
        uVar5 = uVar5 - 6;
      }
    }
    uVar4 = iVar3 + qp_offset_v;
    if (-1 < (int)uVar4) {
      if ((int)uVar4 < 0x3a) {
        uVar4 = gai4_ihevc_qp_table[uVar4];
      }
      else {
        uVar4 = uVar4 - 6;
      }
    }
    uVar5 = uVar5 + tc_offset_div2 * 2 + 2;
    if ((int)uVar5 < 1) {
      uVar5 = 0;
    }
    uVar7 = (ulong)uVar5;
    if (0x34 < (int)uVar5) {
      uVar7 = 0x35;
    }
    uVar4 = uVar4 + tc_offset_div2 * 2 + 2;
    uVar5 = 0;
    if (0 < (int)uVar4) {
      uVar5 = uVar4;
    }
    if (0x34 < (int)uVar5) {
      uVar5 = 0x35;
    }
    iVar3 = gai4_ihevc_tc_table[uVar7];
    iVar1 = gai4_ihevc_tc_table[uVar5];
    if (iVar3 != 0 || iVar1 != 0) {
      iVar6 = -iVar3;
      iVar8 = -iVar1;
      iVar10 = 4;
      do {
        iVar9 = (int)((((uint)pu1_src[-4] + ((uint)*pu1_src - (uint)pu1_src[-2]) * 4) -
                      (uint)pu1_src[2]) + 4) >> 3;
        iVar12 = iVar6;
        if (iVar9 != iVar6 && SBORROW4(iVar9,iVar6) == iVar9 + iVar3 < 0) {
          iVar12 = iVar9;
        }
        if (iVar3 < iVar9) {
          iVar12 = iVar3;
        }
        iVar9 = (uint)*pu1_src - iVar12;
        if (iVar9 < 1) {
          iVar9 = 0;
        }
        if (0xfe < iVar9) {
          iVar9 = 0xff;
        }
        iVar2 = (int)((((uint)pu1_src[-3] + ((uint)pu1_src[1] - (uint)pu1_src[-1]) * 4) -
                      (uint)pu1_src[3]) + 4) >> 3;
        iVar11 = iVar8;
        if (iVar2 != iVar8 && SBORROW4(iVar2,iVar8) == iVar2 + iVar1 < 0) {
          iVar11 = iVar2;
        }
        if (iVar1 < iVar2) {
          iVar11 = iVar1;
        }
        iVar2 = (uint)pu1_src[1] - iVar11;
        if (iVar2 < 1) {
          iVar2 = 0;
        }
        if (0xfe < iVar2) {
          iVar2 = 0xff;
        }
        if (filter_flag_p != 0) {
          iVar11 = iVar11 + (uint)pu1_src[-1];
          if (iVar11 < 1) {
            iVar11 = 0;
          }
          if (0xfe < iVar11) {
            iVar11 = 0xff;
          }
          iVar12 = iVar12 + (uint)pu1_src[-2];
          if (iVar12 < 1) {
            iVar12 = 0;
          }
          if (0xfe < iVar12) {
            iVar12 = 0xff;
          }
          pu1_src[-2] = (byte)iVar12;
          pu1_src[-1] = (byte)iVar11;
        }
        if (filter_flag_q != 0) {
          *pu1_src = (byte)iVar9;
          pu1_src[1] = (byte)iVar2;
        }
        pu1_src = pu1_src + src_strd;
        iVar10 = iVar10 + -1;
      } while (iVar10 != 0);
    }
    return;
  }
  __assert_fail("(filter_flag_p || filter_flag_q)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/common/ihevc_deblk_edge_filter.c"
                ,0x263,
                "void ihevc_deblk_chroma_vert(UWORD8 *, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32)"
               );
}

Assistant:

void ihevc_deblk_chroma_vert(UWORD8 *pu1_src,
                             WORD32 src_strd,
                             WORD32 quant_param_p,
                             WORD32 quant_param_q,
                             WORD32 qp_offset_u,
                             WORD32 qp_offset_v,
                             WORD32 tc_offset_div2,
                             WORD32 filter_flag_p,
                             WORD32 filter_flag_q)
{
    WORD32 qp_indx_u, qp_chroma_u;
    WORD32 qp_indx_v, qp_chroma_v;
    WORD32 tc_indx_u, tc_u;
    WORD32 tc_indx_v, tc_v;
    WORD32 delta_u, tmp_p0_u, tmp_q0_u;
    WORD32 delta_v, tmp_p0_v, tmp_q0_v;
    WORD32 row;

    ASSERT(filter_flag_p || filter_flag_q);

    /* chroma processing is done only if BS is 2             */
    /* this function is assumed to be called only if BS is 2 */
    qp_indx_u = qp_offset_u + ((quant_param_p + quant_param_q + 1) >> 1);
    qp_chroma_u = qp_indx_u < 0 ? qp_indx_u : (qp_indx_u > 57 ? qp_indx_u - 6 : gai4_ihevc_qp_table[qp_indx_u]);

    qp_indx_v = qp_offset_v + ((quant_param_p + quant_param_q + 1) >> 1);
    qp_chroma_v = qp_indx_v < 0 ? qp_indx_v : (qp_indx_v > 57 ? qp_indx_v - 6 : gai4_ihevc_qp_table[qp_indx_v]);

    tc_indx_u = CLIP3(qp_chroma_u + 2 + (tc_offset_div2 << 1), 0, 53);
    tc_u = gai4_ihevc_tc_table[tc_indx_u];

    tc_indx_v = CLIP3(qp_chroma_v + 2 + (tc_offset_div2 << 1), 0, 53);
    tc_v = gai4_ihevc_tc_table[tc_indx_v];

    if(0 == tc_u && 0 == tc_v)
    {
        return;
    }

    for(row = 0; row < 4; row++)
    {
        delta_u = CLIP3((((pu1_src[0] - pu1_src[-2]) << 2) +
                        pu1_src[-4] - pu1_src[2] + 4) >> 3,
                        -tc_u, tc_u);

        tmp_p0_u = CLIP_U8(pu1_src[-2] + delta_u);
        tmp_q0_u = CLIP_U8(pu1_src[0] - delta_u);

        delta_v = CLIP3((((pu1_src[1] - pu1_src[-1]) << 2) +
                        pu1_src[-3] - pu1_src[3] + 4) >> 3,
                        -tc_v, tc_v);

        tmp_p0_v = CLIP_U8(pu1_src[-1] + delta_v);
        tmp_q0_v = CLIP_U8(pu1_src[1] - delta_v);

        if(filter_flag_p != 0)
        {
            pu1_src[-2] = tmp_p0_u;
            pu1_src[-1] = tmp_p0_v;
        }

        if(filter_flag_q != 0)
        {
            pu1_src[0] = tmp_q0_u;
            pu1_src[1] = tmp_q0_v;
        }

        pu1_src += src_strd;
    }

}